

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O3

Option * __thiscall
CLI::App::set_help_all_flag(App *this,string *help_name,string *help_description)

{
  pointer pcVar1;
  Option *pOVar2;
  string local_40;
  
  if (this->help_all_ptr_ != (Option *)0x0) {
    remove_option(this,this->help_all_ptr_);
    this->help_all_ptr_ = (Option *)0x0;
  }
  if (help_name->_M_string_length == 0) {
    pOVar2 = (Option *)0x0;
  }
  else {
    pcVar1 = (help_name->_M_dataplus)._M_p;
    local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
    ::std::__cxx11::string::_M_construct<char*>
              ((string *)&local_40,pcVar1,pcVar1 + help_name->_M_string_length);
    pOVar2 = add_flag<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_(CLI::detail::enabler)0>
                       (this,&local_40,help_description);
    this->help_all_ptr_ = pOVar2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_40._M_dataplus._M_p != &local_40.field_2) {
      operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
      pOVar2 = this->help_all_ptr_;
    }
    (pOVar2->super_OptionBase<CLI::Option>).configurable_ = false;
  }
  return pOVar2;
}

Assistant:

Option *set_help_all_flag(std::string help_name = "", const std::string &help_description = "") {
        // take flag_description by const reference otherwise add_flag tries to assign to flag_description
        if(help_all_ptr_ != nullptr) {
            remove_option(help_all_ptr_);
            help_all_ptr_ = nullptr;
        }

        // Empty name will simply remove the help all flag
        if(!help_name.empty()) {
            help_all_ptr_ = add_flag(help_name, help_description);
            help_all_ptr_->configurable(false);
        }

        return help_all_ptr_;
    }